

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O0

void __thiscall Generators_Uniform2D_Test::TestBody(Generators_Uniform2D_Test *this)

{
  bool bVar1;
  float *pfVar2;
  undefined1 auVar3 [64];
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  Point2f u;
  Uniform2DIter __end1;
  Uniform2DIter __begin1;
  Uniform2D *__range1;
  int count;
  Uniform2DIter *in_stack_fffffffffffffef8;
  AssertionResult *in_stack_ffffffffffffff00;
  AssertionResult *this_00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  AssertionResult *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff1c;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  char *in_stack_ffffffffffffff20;
  Type in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 uVar4;
  AssertionResult local_c8;
  string local_b8 [24];
  char *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  AssertionResult *in_stack_ffffffffffffff78;
  AssertHelper *in_stack_ffffffffffffff80;
  AssertionResult local_78;
  Tuple2<pbrt::Point2,_float> local_68 [4];
  IndexingIterator<pbrt::detail::Uniform2DIter> local_48 [3];
  undefined1 local_30 [24];
  undefined1 *local_18;
  int local_c;
  undefined1 extraout_var [56];
  
  local_c = 0;
  pbrt::Uniform2D::RNGGenerator
            ((Uniform2D *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
             (uint64_t)in_stack_ffffffffffffff00,(uint64_t)in_stack_fffffffffffffef8);
  local_18 = local_30;
  pbrt::detail::IndexingGenerator<pbrt::Uniform2D,_pbrt::detail::Uniform2DIter>::begin
            ((IndexingGenerator<pbrt::Uniform2D,_pbrt::detail::Uniform2DIter> *)
             in_stack_ffffffffffffff00);
  pbrt::detail::IndexingGenerator<pbrt::Uniform2D,_pbrt::detail::Uniform2DIter>::end
            ((IndexingGenerator<pbrt::Uniform2D,_pbrt::detail::Uniform2DIter> *)
             in_stack_ffffffffffffff00);
  while (bVar1 = pbrt::detail::IndexingIterator<pbrt::detail::Uniform2DIter>::operator!=
                           ((IndexingIterator<pbrt::detail::Uniform2DIter> *)
                            in_stack_ffffffffffffff00,in_stack_fffffffffffffef8), bVar1) {
    auVar3._0_8_ = pbrt::detail::Uniform2DIter::operator*
                             ((Uniform2DIter *)
                              CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    auVar3._8_56_ = extraout_var;
    local_68[0] = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar3._0_16_);
    pfVar2 = pbrt::Tuple2<pbrt::Point2,_float>::operator[](local_68,0);
    in_stack_ffffffffffffff1f = false;
    if (0.0 <= *pfVar2) {
      pfVar2 = pbrt::Tuple2<pbrt::Point2,_float>::operator[](local_68,0);
      in_stack_ffffffffffffff1f = false;
      if (*pfVar2 < 1.0) {
        pfVar2 = pbrt::Tuple2<pbrt::Point2,_float>::operator[](local_68,1);
        in_stack_ffffffffffffff1f = false;
        if (0.0 <= *pfVar2) {
          pfVar2 = pbrt::Tuple2<pbrt::Point2,_float>::operator[](local_68,1);
          in_stack_ffffffffffffff1f = *pfVar2 < 1.0;
        }
      }
    }
    in_stack_ffffffffffffff10 = &local_78;
    testing::AssertionResult::AssertionResult
              (in_stack_ffffffffffffff00,SUB81((ulong)in_stack_fffffffffffffef8 >> 0x38,0));
    in_stack_ffffffffffffff1e =
         testing::AssertionResult::operator_cast_to_bool(in_stack_ffffffffffffff10);
    if (!(bool)in_stack_ffffffffffffff1e) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                 in_stack_ffffffffffffff60);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20,
                 CONCAT13(in_stack_ffffffffffffff1f,
                          CONCAT12(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1c)),
                 &in_stack_ffffffffffffff10->success_);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff00);
      std::__cxx11::string::~string(local_b8);
      testing::Message::~Message((Message *)0x64674e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x6467bd);
    local_c = local_c + 1;
    pbrt::detail::IndexingIterator<pbrt::detail::Uniform2DIter>::operator++(local_48);
  }
  uVar4 = 0x20;
  this_00 = &local_c8;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT17(in_stack_ffffffffffffff1f,
                              CONCAT16(in_stack_ffffffffffffff1e,
                                       CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18)
                                      )),&in_stack_ffffffffffffff10->success_,
             (int *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar4,in_stack_ffffffffffffff30));
    testing::AssertionResult::failure_message((AssertionResult *)0x646872);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar4,in_stack_ffffffffffffff30),in_stack_ffffffffffffff2c,
               in_stack_ffffffffffffff20,
               CONCAT13(in_stack_ffffffffffffff1f,
                        CONCAT12(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1c)),
               &in_stack_ffffffffffffff10->success_);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff80,(Message *)in_stack_ffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0x6468be);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x64690a);
  return;
}

Assistant:

TEST(Generators, Uniform2D) {
    int count = 0;
    for (Point2f u : Uniform2D(32)) {
        EXPECT_TRUE(u[0] >= 0 && u[0] < 1 && u[1] >= 0 && u[1] < 1);
        ++count;
    }
    EXPECT_EQ(32, count);
}